

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O3

TypedAttribute<Imf_3_2::Glorp> * __thiscall
Imf_3_2::Header::findTypedAttribute<Imf_3_2::TypedAttribute<Imf_3_2::Glorp>>
          (Header *this,char *name)

{
  const_iterator cVar1;
  TypedAttribute<Imf_3_2::Glorp> *pTVar2;
  key_type local_110;
  
  strncpy(local_110._text,name,0xff);
  local_110._text[0xff] = '\0';
  cVar1 = std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Attribute_*>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Attribute_*>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Attribute_*>_>_>
          ::find((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Attribute_*>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Attribute_*>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Attribute_*>_>_>
                  *)this,&local_110);
  if ((cVar1._M_node == (_Base_ptr)(this + 8)) || (*(long *)(cVar1._M_node + 9) == 0)) {
    pTVar2 = (TypedAttribute<Imf_3_2::Glorp> *)0x0;
  }
  else {
    pTVar2 = (TypedAttribute<Imf_3_2::Glorp> *)
             __dynamic_cast(*(long *)(cVar1._M_node + 9),&Attribute::typeinfo,
                            &TypedAttribute<Imf_3_2::Glorp>::typeinfo,0);
  }
  return pTVar2;
}

Assistant:

const T*
Header::findTypedAttribute (const char name[]) const
{
    AttributeMap::const_iterator i = _map.find (name);
    return (i == _map.end ()) ? 0 : dynamic_cast<const T*> (i->second);
}